

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neural_layer.cpp
# Opt level: O0

void __thiscall
neural_networks::utilities::NeuralLayer::NeuralLayer(NeuralLayer *this,NeuralLayer *other)

{
  NeuralMatrix *this_00;
  Matrix<long_double> *pMVar1;
  NeuralLayer *other_local;
  NeuralLayer *this_local;
  
  this->_vptr_NeuralLayer = (_func_int **)&PTR_update_00119bb8;
  std::__cxx11::string::string((string *)&this->label);
  this->N = other->N;
  this_00 = (NeuralMatrix *)operator_new(0x30);
  NeuralMatrix::NeuralMatrix
            (this_00,(other->data->super_Matrix<neural_networks::utilities::Neuron_*>).N,1,false,
             false);
  this->data = this_00;
  if (other->weights != (Matrix<long_double> *)0x0) {
    pMVar1 = (Matrix<long_double> *)operator_new(0x30);
    Matrix<long_double>::Matrix(pMVar1,other->bias);
    this->bias = pMVar1;
    pMVar1 = (Matrix<long_double> *)operator_new(0x30);
    Matrix<long_double>::Matrix(pMVar1,other->weights);
    this->weights = pMVar1;
  }
  return;
}

Assistant:

NeuralLayer::NeuralLayer(const NeuralLayer &other) : N(other.N) {
    // N should be the same for each matrix
    data = new NeuralMatrix(other.data -> N, 1);
    // this is only in the case of the input matrix, which has no weight or bias matrix
    if(!other.weights) {
        return;
    }
    // Matrix copy constructor should be copying not replacing
    bias = new Matrix<long double>(*other.bias); // for all the matrices
    weights = new Matrix<long double>(*other.weights);
}